

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauDsd.c
# Opt level: O0

word Dau_Dsd6ToTruth_rec(char *pStr,char **p,int *pMatches,word *pTruths)

{
  int nVars_00;
  int iVar1;
  char *pcVar2;
  word wVar3;
  bool bVar4;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  int local_12c;
  int nVars_1;
  int i;
  char *q_4;
  word Res_3;
  word Fanins_1 [6];
  word Func;
  char *q_3;
  char *q2;
  char *q_2;
  char *pOld;
  word *pTruths2;
  word Fanins [6];
  word Res_2;
  word *pTemp;
  word Temp [3];
  char *pcStack_58;
  int nVars;
  word Res_1;
  char *q_1;
  word Res;
  char *q;
  int fCompl;
  word *pTruths_local;
  int *pMatches_local;
  char **p_local;
  char *pStr_local;
  
  bVar4 = **p == '!';
  if (bVar4) {
    *p = *p + 1;
  }
  if ((**p < 'a') || ('f' < **p)) {
    if (**p == '(') {
      pcVar2 = pStr + pMatches[(long)*p - (long)pStr];
      q_1 = (char *)0xffffffffffffffff;
      if ((**p != '(') || (*pcVar2 != ')')) {
        __assert_fail("**p == \'(\' && *q == \')\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x16f,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      *p = *p + 1;
      while (*p < pcVar2) {
        wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
        q_1 = (char *)(wVar3 & (ulong)q_1);
        *p = *p + 1;
      }
      if (*p != pcVar2) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x172,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (bVar4) {
        local_140 = (char *)((ulong)q_1 ^ 0xffffffffffffffff);
      }
      else {
        local_140 = q_1;
      }
      pStr_local = local_140;
    }
    else if (**p == '[') {
      pcVar2 = pStr + pMatches[(long)*p - (long)pStr];
      pcStack_58 = (char *)0x0;
      if ((**p != '[') || (*pcVar2 != ']')) {
        __assert_fail("**p == \'[\' && *q == \']\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x179,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      *p = *p + 1;
      while (*p < pcVar2) {
        wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
        pcStack_58 = (char *)(wVar3 ^ (ulong)pcStack_58);
        *p = *p + 1;
      }
      if (*p != pcVar2) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x17c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (bVar4) {
        local_148 = (char *)((ulong)pcStack_58 ^ 0xffffffffffffffff);
      }
      else {
        local_148 = pcStack_58;
      }
      pStr_local = local_148;
    }
    else if (**p == '<') {
      Temp[2]._4_4_ = 0;
      q_2 = *p;
      pOld = (char *)pTruths;
      if (pStr[(long)pMatches[(long)*p - (long)pStr] + 1] == '{') {
        *p = pStr + (long)pMatches[(long)*p - (long)pStr] + 1;
        pcVar2 = pStr + pMatches[(long)*p - (long)pStr];
        if ((**p != '{') || (*pcVar2 != '}')) {
          __assert_fail("**p == \'{\' && *q2 == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,0x18c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        Temp[2]._4_4_ = 0;
        *p = *p + 1;
        while (*p < pcVar2) {
          wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
          Fanins[(long)Temp[2]._4_4_ + -1] = wVar3;
          *p = *p + 1;
          Temp[2]._4_4_ = Temp[2]._4_4_ + 1;
        }
        if (*p != pcVar2) {
          __assert_fail("*p == q2",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,399,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        pOld = (char *)&pTruths2;
      }
      *p = q_2;
      pcVar2 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '<') || (*pcVar2 != '>')) {
        __assert_fail("**p == \'<\' && *q == \'>\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x197,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (Temp[2]._4_4_ != 0) {
        for (; q_2 < pcVar2; q_2 = q_2 + 1) {
          if ((('`' < *q_2) && (*q_2 < '{')) && (Temp[2]._4_4_ <= *q_2 + -0x61)) {
            __assert_fail("*pOld - \'a\' < nVars",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                          ,0x19c,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
          }
        }
      }
      *p = *p + 1;
      Res_2 = (word)&pTemp;
      while (*p < pcVar2) {
        wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,(word *)pOld);
        *(word *)Res_2 = wVar3;
        *p = *p + 1;
        Res_2 = Res_2 + 8;
      }
      if ((word *)Res_2 != Temp + 2) {
        __assert_fail("pTemp == Temp + 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1a0,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (*p != pcVar2) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1a1,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (pcVar2[1] == '{') {
        pcVar2 = *p;
        *p = pcVar2 + 1;
        if ((**p != '{') || (pStr[pMatches[(long)(pcVar2 + 1) - (long)pStr]] != '}')) {
          __assert_fail("**p == \'{\' && *q == \'}\'",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                        ,0x1a5,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
        }
        *p = pStr + pMatches[(long)(pcVar2 + 1) - (long)pStr];
      }
      local_150 = (char *)((ulong)pTemp & Temp[0] | ((ulong)pTemp ^ 0xffffffffffffffff) & Temp[1]);
      if (bVar4) {
        local_150 = (char *)((ulong)local_150 ^ 0xffffffffffffffff);
      }
      pStr_local = local_150;
    }
    else {
      if (((**p < 'A') || ('F' < **p)) && ((**p < '0' || ('9' < **p)))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1ba,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      nVars_00 = Abc_TtReadHex(Fanins_1 + 5,*p);
      iVar1 = Abc_TtHexDigitNum(nVars_00);
      *p = *p + iVar1;
      pcVar2 = pStr + pMatches[(long)*p - (long)pStr];
      if ((**p != '{') || (*pcVar2 != '}')) {
        __assert_fail("**p == \'{\' && *q == \'}\'",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b2,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      local_12c = 0;
      *p = *p + 1;
      while (*p < pcVar2) {
        wVar3 = Dau_Dsd6ToTruth_rec(pStr,p,pMatches,pTruths);
        Fanins_1[(long)local_12c + -1] = wVar3;
        *p = *p + 1;
        local_12c = local_12c + 1;
      }
      if (local_12c != nVars_00) {
        __assert_fail("i == nVars",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b5,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      if (*p != pcVar2) {
        __assert_fail("*p == q",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                      ,0x1b6,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
      }
      local_158 = (char *)Dau_Dsd6TruthCompose_rec(Fanins_1[5],&Res_3,nVars_00);
      if (bVar4) {
        local_158 = (char *)((ulong)local_158 ^ 0xffffffffffffffff);
      }
      pStr_local = local_158;
    }
  }
  else {
    if ((**p + -0x61 < 0) || (5 < **p + -0x61)) {
      __assert_fail("**p - \'a\' >= 0 && **p - \'a\' < 6",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/dau/dauDsd.c"
                    ,0x168,"word Dau_Dsd6ToTruth_rec(char *, char **, int *, word *)");
    }
    if (bVar4) {
      local_138 = (char *)(pTruths[**p + -0x61] ^ 0xffffffffffffffff);
    }
    else {
      local_138 = (char *)pTruths[**p + -0x61];
    }
    pStr_local = local_138;
  }
  return (word)pStr_local;
}

Assistant:

word Dau_Dsd6ToTruth_rec( char * pStr, char ** p, int * pMatches, word * pTruths )
{
    int fCompl = 0;
    if ( **p == '!' )
        (*p)++, fCompl = 1;
    if ( **p >= 'a' && **p <= 'f' ) // var
    {
        assert( **p - 'a' >= 0 && **p - 'a' < 6 );
        return fCompl ? ~pTruths[**p - 'a'] : pTruths[**p - 'a'];
    }
    if ( **p == '(' ) // and/or
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word Res = ~(word)0;
        assert( **p == '(' && *q == ')' );
        for ( (*p)++; *p < q; (*p)++ )
            Res &= Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( *p == q );
        return fCompl ? ~Res : Res;
    }
    if ( **p == '[' ) // xor
    {
        char * q = pStr + pMatches[ *p - pStr ];
        word Res = 0;
        assert( **p == '[' && *q == ']' );
        for ( (*p)++; *p < q; (*p)++ )
            Res ^= Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( *p == q );
        return fCompl ? ~Res : Res;
    }
    if ( **p == '<' ) // mux
    {
        int nVars = 0;
        word Temp[3], * pTemp = Temp, Res;
        word Fanins[6], * pTruths2;
        char * pOld = *p;
        char * q = pStr + pMatches[ *p - pStr ];
        // read fanins
        if ( *(q+1) == '{' )
        {
            char * q2;
            *p = q+1;
            q2 = pStr + pMatches[ *p - pStr ];
            assert( **p == '{' && *q2 == '}' );
            for ( nVars = 0, (*p)++; *p < q2; (*p)++, nVars++ )
                Fanins[nVars] = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
            assert( *p == q2 );
            pTruths2 = Fanins;
        }
        else
            pTruths2 = pTruths;
        // read MUX
        *p = pOld;
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '<' && *q == '>' );
        // verify internal variables
        if ( nVars )
            for ( ; pOld < q; pOld++ )
                if ( *pOld >= 'a' && *pOld <= 'z' )
                    assert( *pOld - 'a' < nVars );
        // derive MAX components
        for ( (*p)++; *p < q; (*p)++ )
            *pTemp++ = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths2 );
        assert( pTemp == Temp + 3 );
        assert( *p == q );
        if ( *(q+1) == '{' ) // and/or
        {
            char * q = pStr + pMatches[ ++(*p) - pStr ];
            assert( **p == '{' && *q == '}' );
            *p = q;
        }
        Res = (Temp[0] & Temp[1]) | (~Temp[0] & Temp[2]);
        return fCompl ? ~Res : Res;
    }
    if ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
    {
        word Func, Fanins[6], Res;
        char * q;
        int i, nVars = Abc_TtReadHex( &Func, *p );
        *p += Abc_TtHexDigitNum( nVars );
        q = pStr + pMatches[ *p - pStr ];
        assert( **p == '{' && *q == '}' );
        for ( i = 0, (*p)++; *p < q; (*p)++, i++ )
            Fanins[i] = Dau_Dsd6ToTruth_rec( pStr, p, pMatches, pTruths );
        assert( i == nVars );
        assert( *p == q );
        Res = Dau_Dsd6TruthCompose_rec( Func, Fanins, nVars );
        return fCompl ? ~Res : Res;
    }
    assert( 0 );
    return 0;
}